

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QByteArray,_QPalette>_>::freeData
          (Span<QHashPrivate::Node<QByteArray,_QPalette>_> *this)

{
  byte bVar1;
  char *pcVar2;
  Node<QByteArray,_QPalette> *pNVar3;
  Node<QByteArray,_QPalette> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<QByteArray,_QPalette> *local_18;
  
  if (in_RDI[3].key.d.ptr != (char *)0x0) {
    pNVar3 = in_RDI + 3;
    for (local_18 = in_RDI; local_18 != (Node<QByteArray,_QPalette> *)&(pNVar3->key).d.ptr;
        local_18 = (Node<QByteArray,_QPalette> *)((long)&(local_18->key).d.d + 1)) {
      bVar1 = *(byte *)&(local_18->key).d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[3].key.d.ptr + (ulong)bVar1 * 0x28));
        Node<QByteArray,_QPalette>::~Node(in_RDI);
      }
    }
    pcVar2 = in_RDI[3].key.d.ptr;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    in_RDI[3].key.d.ptr = (char *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }